

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall google::protobuf::Arena::CallDestructorHooks(Arena *this)

{
  uint64 uVar1;
  ArenaImpl *in_RDI;
  uint64 space_allocated;
  
  uVar1 = internal::ArenaImpl::SpaceAllocated(in_RDI);
  if (in_RDI[1].hint_._M_b._M_p != (__pointer_type)0x0) {
    (*(code *)in_RDI[1].hint_._M_b._M_p)(in_RDI,in_RDI[1].initial_block_,uVar1);
  }
  if (in_RDI[1].space_allocated_.super___atomic_base<unsigned_long>._M_i != 0) {
    (*(code *)in_RDI[1].space_allocated_.super___atomic_base<unsigned_long>._M_i)
              (in_RDI,in_RDI[1].initial_block_,uVar1);
  }
  return;
}

Assistant:

void Arena::CallDestructorHooks() {
  uint64 space_allocated = impl_.SpaceAllocated();
  // Call the reset hook
  if (on_arena_reset_ != NULL) {
    on_arena_reset_(this, hooks_cookie_, space_allocated);
  }

  // Call the destruction hook
  if (on_arena_destruction_ != NULL) {
    on_arena_destruction_(this, hooks_cookie_, space_allocated);
  }
}